

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

void mixer_pp_callback(void *buf,uint samples,void *userdata)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int sample_size;
  int nch;
  ALLEGRO_MIXER *mixer;
  int local_24;
  
  if (saving) {
    iVar1 = al_get_mixer_channels(in_RDX);
    if (iVar1 == 0x10) {
      local_24 = 1;
    }
    else {
      if (iVar1 != 0x20) {
        return;
      }
      local_24 = 2;
    }
    uVar2 = al_get_mixer_depth(in_RDX);
    iVar1 = al_get_audio_depth_size(uVar2);
    al_fwrite(save_fp,in_RDI,local_24 * in_ESI * iVar1);
  }
  return;
}

Assistant:

static void mixer_pp_callback(void *buf, unsigned int samples, void *userdata)
{
   ALLEGRO_MIXER *mixer = (ALLEGRO_MIXER *)userdata;
   int nch;
   int sample_size;

   if (!saving)
      return;

   switch (al_get_mixer_channels(mixer)) {
      case ALLEGRO_CHANNEL_CONF_1:
         nch = 1;
         break;
      case ALLEGRO_CHANNEL_CONF_2:
         nch = 2;
         break;
      default:
         /* Not supported. */
         return;
   }

   sample_size = al_get_audio_depth_size(al_get_mixer_depth(mixer));
   al_fwrite(save_fp, buf, nch * samples * sample_size);
}